

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O1

uint32_t Bernstein(char *key,int len,uint32_t seed)

{
  byte bVar1;
  byte *pbVar2;
  
  if (0 < len) {
    pbVar2 = (byte *)(key + len);
    do {
      bVar1 = *key;
      key = (char *)((byte *)key + 1);
      seed = (uint)bVar1 + seed * 0x21;
    } while (key < pbVar2);
  }
  return seed;
}

Assistant:

uint32_t
Bernstein(const char *key, int len, uint32_t seed)
{
  const uint8_t  *data = (const uint8_t *)key;
  const uint8_t *const end = &data[len];
  while (data < end) {
    //seed = ((seed << 5) + seed) + *data++;
    seed = 33 * seed + *data++;
  }
  return seed;
}